

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlancedBinaryTree.c
# Opt level: O0

int InsertAVL(BiTree *T,int data,int *taller)

{
  int iVar1;
  BiTree pBVar2;
  int *taller_local;
  int data_local;
  BiTree *T_local;
  
  if (*T == (BiTree)0x0) {
    pBVar2 = (BiTree)malloc(0x18);
    *T = pBVar2;
    (*T)->bf = 0;
    (*T)->lchild = (BiTNode *)0x0;
    (*T)->rchlid = (BiTNode *)0x0;
    (*T)->data = data;
    *taller = 1;
  }
  else {
    if (data == (*T)->data) {
      *taller = 0;
      return 0;
    }
    if (data < (*T)->data) {
      iVar1 = InsertAVL(&(*T)->lchild,data,taller);
      if (iVar1 == 0) {
        *taller = 0;
        return 0;
      }
      if (*taller != 0) {
        iVar1 = (*T)->bf;
        if (iVar1 == -1) {
          (*T)->bf = 0;
          *taller = 0;
        }
        else if (iVar1 == 0) {
          (*T)->bf = 1;
          *taller = 1;
        }
        else if (iVar1 == 1) {
          LeftBalance(T);
          *taller = 0;
        }
      }
    }
    else {
      iVar1 = InsertAVL(&(*T)->rchlid,data,taller);
      if (iVar1 == 0) {
        *taller = 0;
        return 0;
      }
      if (*taller != 0) {
        iVar1 = (*T)->bf;
        if (iVar1 == -1) {
          RightBalance(T);
          *taller = 0;
        }
        else if (iVar1 == 0) {
          (*T)->bf = -1;
          *taller = 1;
        }
        else if (iVar1 == 1) {
          (*T)->bf = 0;
          *taller = 0;
        }
      }
    }
  }
  return 1;
}

Assistant:

int InsertAVL(BiTree *T,int data,int *taller)
{
    if(*T == NULL)  //找到插入位置
    {
        *T = (BiTree)malloc(sizeof(BiTNode));
        (*T)->bf = EH;
        (*T)->rchlid = (*T)->lchild = NULL;
        (*T)->data = data;
        *taller = true;
    }
    else
    {
        if(data == (*T)->data)  //树中有相同的结点数据直接返回
        {
            *taller = false;
            return false;
        }
        if(data < (*T)->data)   //往左子树搜索进行插入
        {
            if(!InsertAVL(&(*T)->lchild,data,taller))   //树中有相同的结点
            {
                *taller = false;
                return false;
            }
            if (*taller)
            {
                switch ((*T)->bf)               //T插入结点后，检测平衡因子，根据情况，做相应的修改和旋转
                {
                    case LH:
                        LeftBalance(T);             //插入后左边不平衡了，让其左平衡
                        *taller = false;
                        break;
                    case EH:
                        (*T)->bf = LH;
                        *taller = true;
                        break;
                    case RH:
                        (*T)->bf = EH;
                        *taller = false;
                        break;
                }
            }
        }
        else                    //往右子树搜索进行插入
        {
            if(!InsertAVL(&(*T)->rchlid,data,taller))      //树中有相同的结点
            {
                *taller = false;
                return false;
            }
            if (*taller)        //插入到右子树中且长高了
            {
                switch ((*T)->bf)                       //T插入结点后，检测平衡因子，根据情况，做相应的修改和旋转
                {
                    case LH:
                        (*T)->bf = EH;
                        *taller = false;
                        break;
                    case EH:
                        (*T)->bf = RH;
                        *taller = true;
                        break;
                    case RH:
                        RightBalance(T);                       //插入后右边不平衡了，让其右平衡
                        *taller = false;
                        break;
                }
            }
        }
    }
    return true;
}